

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

int mg_path_equal(mg_path *lhs,mg_path *rhs)

{
  uint uVar1;
  uint uVar2;
  mg_node **ppmVar3;
  mg_node **ppmVar4;
  mg_unbound_relationship **ppmVar5;
  mg_unbound_relationship **ppmVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar1 = lhs->node_count;
  uVar8 = 0;
  if (((uVar1 == rhs->node_count) &&
      (uVar2 = lhs->relationship_count, uVar8 = 0, uVar2 == rhs->relationship_count)) &&
     (uVar9 = (ulong)lhs->sequence_length, lhs->sequence_length == rhs->sequence_length)) {
    if ((ulong)uVar1 != 0) {
      ppmVar3 = lhs->nodes;
      ppmVar4 = rhs->nodes;
      uVar11 = 0;
      do {
        iVar7 = mg_node_equal(ppmVar3[uVar11],ppmVar4[uVar11]);
        if (iVar7 == 0) {
          return 0;
        }
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    if ((ulong)uVar2 != 0) {
      ppmVar5 = lhs->relationships;
      ppmVar6 = rhs->relationships;
      uVar11 = 0;
      do {
        iVar7 = mg_unbound_relationship_equal(ppmVar5[uVar11],ppmVar6[uVar11]);
        if (iVar7 == 0) {
          return 0;
        }
        uVar11 = uVar11 + 1;
      } while (uVar2 != uVar11);
    }
    if (uVar9 == 0) {
      uVar8 = 1;
    }
    else {
      uVar8 = 0;
      if (*lhs->sequence == *rhs->sequence) {
        uVar11 = 1;
        do {
          uVar10 = uVar11;
          if (uVar9 == uVar10) break;
          uVar11 = uVar10 + 1;
        } while (lhs->sequence[uVar10] == rhs->sequence[uVar10]);
        uVar8 = (uint)(uVar9 <= uVar10);
      }
    }
  }
  return uVar8;
}

Assistant:

int mg_path_equal(const mg_path *lhs, const mg_path *rhs) {
  if (lhs->node_count != rhs->node_count ||
      lhs->relationship_count != rhs->relationship_count ||
      lhs->sequence_length != rhs->sequence_length) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->node_count; ++i) {
    if (!mg_node_equal(lhs->nodes[i], rhs->nodes[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->relationship_count; ++i) {
    if (!mg_unbound_relationship_equal(lhs->relationships[i],
                                       rhs->relationships[i])) {
      return 0;
    }
  }
  for (uint32_t i = 0; i < lhs->sequence_length; ++i) {
    if (lhs->sequence[i] != rhs->sequence[i]) {
      return 0;
    }
  }
  return 1;
}